

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_fload(jit_State *J)

{
  IRRef1 IVar1;
  ushort uVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRRef fid;
  IRRef oref;
  jit_State *J_local;
  
  store._4_4_ = (uint)(J->fold).ins.field_0.op1;
  IVar1 = (J->fold).ins.field_0.op2;
  uVar2 = J->chain[0x4d];
  do {
    store._0_4_ = (uint)uVar2;
    if ((uint)store <= store._4_4_) {
      if ((IVar1 == 5) &&
         ((pIVar3 = (J->cur).ir, (&pIVar3->field_1)[store._4_4_].o == 'Q' ||
          ((&pIVar3->field_1)[store._4_4_].o == 'R')))) {
        J_local._4_4_ = lj_ir_knull(J,IRT_TAB);
      }
      else {
LAB_00132599:
        J_local._4_4_ = lj_opt_cselim(J,store._4_4_);
      }
      return J_local._4_4_;
    }
    pIVar3 = (J->cur).ir + (uint)store;
    AVar4 = aa_fref(J,&(J->fold).ins,(J->cur).ir + (pIVar3->field_0).op1);
    if (AVar4 != ALIAS_NO) {
      if (AVar4 == ALIAS_MAY) {
        store._4_4_ = (uint)store;
        goto LAB_00132599;
      }
      if (AVar4 == ALIAS_MUST) {
        return (uint)(pIVar3->field_0).op2;
      }
    }
    uVar2 = (pIVar3->field_0).prev;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_fload(jit_State *J)
{
  IRRef oref = fins->op1;  /* Object reference. */
  IRRef fid = fins->op2;  /* Field ID. */
  IRRef lim = oref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_FSTORE];
  while (ref > oref) {
    IRIns *store = IR(ref);
    switch (aa_fref(J, fins, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store: const-fold field loads from allocations. */
  if (fid == IRFL_TAB_META) {
    IRIns *ir = IR(oref);
    if (ir->o == IR_TNEW || ir->o == IR_TDUP)
      return lj_ir_knull(J, IRT_TAB);
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}